

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
ghc::filesystem::operator<<(basic_ostream<char,_std::char_traits<char>_> *os,path *p)

{
  char cVar1;
  pointer pcVar2;
  long *plVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ps;
  char local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  pcVar2 = (p->_path)._M_dataplus._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_50,pcVar2,pcVar2 + (p->_path)._M_string_length);
  plVar3 = local_50;
  if (local_48 != 0) {
    lVar4 = 0;
    do {
      cVar1 = *(char *)((long)plVar3 + lVar4);
      if ((cVar1 == '\\') || (cVar1 == '\"')) {
        local_51 = '\\';
        std::__ostream_insert<char,std::char_traits<char>>(os,&local_51,1);
      }
      local_51 = cVar1;
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_51,1);
      lVar4 = lVar4 + 1;
    } while (local_48 != lVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return os;
}

Assistant:

inline std::basic_ostream<charT, traits>& operator<<(std::basic_ostream<charT, traits>& os, const path& p)
{
    os << "\"";
    auto ps = p.string<charT, traits>();
    for (auto c : ps) {
        if (c == '"' || c == '\\') {
            os << '\\';
        }
        os << c;
    }
    os << "\"";
    return os;
}